

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O1

void __thiscall antlr::BitSet::BitSet(BitSet *this,unsigned_long *bits_,uint nlongs)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  allocator_type local_1a;
  bool local_19;
  
  uVar5 = nlongs << 5;
  local_19 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->storage,(ulong)uVar5,&local_19,&local_1a);
  if (uVar5 != 0) {
    lVar1 = (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar2 = 0;
    do {
      uVar3 = uVar2 >> 6;
      uVar4 = 1L << ((byte)uVar2 & 0x3f);
      if (((uint)bits_[uVar2 >> 5 & 0x7ffffff] >> ((uint)uVar2 & 0x1f) & 1) == 0) {
        uVar4 = ~uVar4 & *(ulong *)(lVar1 + uVar3 * 8);
      }
      else {
        uVar4 = uVar4 | *(ulong *)(lVar1 + uVar3 * 8);
      }
      *(ulong *)(lVar1 + uVar3 * 8) = uVar4;
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  return;
}

Assistant:

BitSet::BitSet( const unsigned long* bits_, unsigned int nlongs )
: storage(nlongs*32)
{
	for ( unsigned int i = 0 ; i < (nlongs * 32); i++)
		storage[i] = (bits_[i>>5] & (1UL << (i&31))) ? true : false;
}